

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  uint size;
  array_container_t *paVar1;
  int *piVar2;
  void *pvVar3;
  bitset_container_t *bitset;
  int iVar4;
  undefined6 in_register_0000000a;
  
  iVar4 = (int)CONCAT62(in_register_0000000a,step);
  if (iVar4 == 0) {
    return (container_t *)0x0;
  }
  if (iVar4 != 1) {
    size = (~min + max + (uint)step) / (uint)step;
    if ((int)size < 0x1001) {
      *type = '\x02';
      paVar1 = array_container_create_given_capacity(size);
      array_container_add_from_range(paVar1,min,max,step);
      return paVar1;
    }
    *type = '\x01';
    bitset = bitset_container_create();
    bitset_container_add_from_range(bitset,min,max,step);
    return bitset;
  }
  if ((max - min) + 1 < 3) {
    *type = '\x02';
    paVar1 = array_container_create_range(min,max);
    return paVar1;
  }
  *type = '\x03';
  piVar2 = (int *)(*global_memory_hook.malloc)(0x10);
  if (piVar2 != (int *)0x0) {
    pvVar3 = (*global_memory_hook.malloc)(4);
    *(void **)(piVar2 + 2) = pvVar3;
    if (pvVar3 != (void *)0x0) {
      piVar2[0] = 0;
      piVar2[1] = 1;
      goto LAB_0011916b;
    }
    (*global_memory_hook.free)(piVar2);
  }
  piVar2 = (int *)0x0;
LAB_0011916b:
  if (piVar2 != (int *)0x0) {
    *(uint32_t *)(*(long *)(piVar2 + 2) + (long)*piVar2 * 4) = min & 0xffff | (~min + max) * 0x10000
    ;
    *piVar2 = *piVar2 + 1;
  }
  return piVar2;
}

Assistant:

static inline container_t *container_from_range(uint8_t *type, uint32_t min,
                                                uint32_t max, uint16_t step) {
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min, max, type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        // return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}